

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O3

int Gia_ManCountDepth(Gia_ManEra_t *p)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  
  uVar1 = p->vStates->nSize;
  lVar6 = (long)(int)uVar1;
  if (lVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  ppvVar3 = p->vStates->pArray;
  pvVar7 = ppvVar3[lVar6 + -1];
  if (((uVar1 < 4) || (*(int *)((long)pvVar7 + 8) != 0)) ||
     (pvVar7 = ppvVar3[lVar6 + -2], pvVar7 != (void *)0x0)) {
    iVar4 = 1;
    do {
      iVar5 = iVar4;
      uVar2 = *(uint *)((long)pvVar7 + 8);
      if ((ulong)uVar2 == 0) {
        return iVar5;
      }
      if (uVar1 <= uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar7 = ppvVar3[uVar2];
      iVar4 = iVar5 + 1;
    } while (pvVar7 != (void *)0x0);
  }
  else {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Gia_ManCountDepth( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pState;
    int Counter = 0;
    pState = (Gia_ObjEra_t *)Vec_PtrEntryLast( p->vStates );
    if ( pState->iPrev == 0 && Vec_PtrSize(p->vStates) > 3 )
        pState = (Gia_ObjEra_t *)Vec_PtrEntry( p->vStates, Vec_PtrSize(p->vStates) - 2 );
    for ( ; pState; pState = pState->iPrev ? Gia_ManEraState(p, pState->iPrev) : NULL )
        Counter++;
    return Counter;
}